

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::LengthFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffffab4;
  undefined4 in_stack_fffffffffffffabc;
  FunctionNullHandling in_stack_fffffffffffffac8;
  bind_lambda_function_t in_stack_fffffffffffffad0;
  LogicalType local_528;
  LogicalType local_510;
  scalar_function_t local_4f8;
  scalar_function_t local_4d8;
  LogicalType local_4b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4a0;
  LogicalType local_488;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_470;
  LogicalType local_458;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_440;
  _Any_data local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  LogicalType local_400;
  LogicalType local_3e8;
  LogicalType local_3d0;
  string local_3b8;
  ScalarFunction local_398;
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  ::std::__cxx11::string::string((string *)&local_3b8,"length",(allocator *)&local_528);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_3b8);
  ::std::__cxx11::string::~string((string *)&local_3b8);
  LogicalType::LogicalType(&local_528,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_440,__l,(allocator_type *)&local_510);
  LogicalType::LogicalType(&local_458,BIGINT);
  local_4d8.super__Function_base._M_functor._8_8_ = 0;
  local_4d8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::string_t,long,duckdb::StringLengthOperator>;
  local_4d8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_4d8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3d0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_3d0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffab4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffabc;
  ScalarFunction::ScalarFunction
            (&local_148,(vector<duckdb::LogicalType,_true> *)&local_440,&local_458,&local_4d8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,LengthPropagateStats,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffac8,
             in_stack_fffffffffffffad0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_148);
  ScalarFunction::~ScalarFunction(&local_148);
  LogicalType::~LogicalType(&local_3d0);
  ::std::_Function_base::~_Function_base(&local_4d8.super__Function_base);
  LogicalType::~LogicalType(&local_458);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_440);
  LogicalType::~LogicalType(&local_528);
  LogicalType::LogicalType(&local_528,BIT);
  __l_00._M_len = 1;
  __l_00._M_array = &local_528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_470,__l_00,(allocator_type *)&local_510);
  LogicalType::LogicalType(&local_488,BIGINT);
  local_4f8.super__Function_base._M_functor._8_8_ = 0;
  local_4f8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::string_t,long,duckdb::BitStringLenOperator>;
  local_4f8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_4f8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3e8,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_3e8;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffab4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffabc;
  ScalarFunction::ScalarFunction
            (&local_270,(vector<duckdb::LogicalType,_true> *)&local_470,&local_488,&local_4f8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_270);
  ScalarFunction::~ScalarFunction(&local_270);
  LogicalType::~LogicalType(&local_3e8);
  ::std::_Function_base::~_Function_base(&local_4f8.super__Function_base);
  LogicalType::~LogicalType(&local_488);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_470);
  LogicalType::~LogicalType(&local_528);
  LogicalType::LogicalType(&local_510,ANY);
  LogicalType::LIST(&local_528,&local_510);
  __l_01._M_len = 1;
  __l_01._M_array = &local_528;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_4a0,__l_01,(allocator_type *)&stack0xfffffffffffffad7);
  LogicalType::LogicalType(&local_4b8,BIGINT);
  local_418 = 0;
  uStack_410 = 0;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  LogicalType::LogicalType(&local_400,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_400;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffab4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffabc;
  ScalarFunction::ScalarFunction
            (&local_398,(vector<duckdb::LogicalType,_true> *)&local_4a0,&local_4b8,
             (scalar_function_t *)&local_428,ArrayOrListLengthBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_01,CONSISTENT,in_stack_fffffffffffffac8,in_stack_fffffffffffffad0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_398);
  ScalarFunction::~ScalarFunction(&local_398);
  LogicalType::~LogicalType(&local_400);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_428);
  LogicalType::~LogicalType(&local_4b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4a0);
  LogicalType::~LogicalType(&local_528);
  LogicalType::~LogicalType(&local_510);
  return in_RDI;
}

Assistant:

ScalarFunctionSet LengthFun::GetFunctions() {
	ScalarFunctionSet length("length");
	length.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::BIGINT,
	                                  ScalarFunction::UnaryFunction<string_t, int64_t, StringLengthOperator>, nullptr,
	                                  nullptr, LengthPropagateStats));
	length.AddFunction(ScalarFunction({LogicalType::BIT}, LogicalType::BIGINT,
	                                  ScalarFunction::UnaryFunction<string_t, int64_t, BitStringLenOperator>));
	length.AddFunction(
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::BIGINT, nullptr, ArrayOrListLengthBind));
	return (length);
}